

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-math.h
# Opt level: O2

double mp::round_to_digits<double>(double value,int digits)

{
  double dVar1;
  double dVar2;
  
  if ((value == 0.0) && (!NAN(value))) {
    return 0.0;
  }
  dVar1 = log10(ABS(value));
  dVar1 = ceil(dVar1);
  dVar1 = pow(10.0,(double)digits - dVar1);
  dVar2 = round(value * dVar1);
  return dVar2 / dVar1;
}

Assistant:

F round_to_digits(F value, int digits) {
    if (value == 0.0) // otherwise it will return 'nan'
        return 0.0;   // due to the log10() of zero

    F factor = std::pow(10.0,
                        digits
                        - std::ceil(std::log10(std::fabs(value))));
    return std::round(value * factor) / factor;
}